

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O0

void __thiscall
spdlog::logger::set_pattern(logger *this,string *pattern,pattern_time_type time_type)

{
  unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_> *in_RDI;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *in_stack_00000018;
  logger *in_stack_00000020;
  unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
  new_formatter;
  pattern_time_type *in_stack_00000070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000078;
  unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_> *this_00;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *this_01;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> local_28;
  unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
  local_20 [4];
  
  this_00 = local_20;
  details::make_unique<spdlog::pattern_formatter,std::__cxx11::string,spdlog::pattern_time_type&>
            (in_stack_00000078,in_stack_00000070);
  this_01 = &local_28;
  std::unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>>::
  unique_ptr<spdlog::pattern_formatter,std::default_delete<spdlog::pattern_formatter>,void>
            (this_01,in_RDI);
  set_formatter(in_stack_00000020,in_stack_00000018);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr(this_01);
  std::unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>::
  ~unique_ptr(this_00);
  return;
}

Assistant:

SPDLOG_INLINE void logger::set_pattern(std::string pattern, pattern_time_type time_type) {
    auto new_formatter = details::make_unique<pattern_formatter>(std::move(pattern), time_type);
    set_formatter(std::move(new_formatter));
}